

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyLoop::~IfcPolyLoop(IfcPolyLoop *this,void **vtt)

{
  void **vtt_local;
  IfcPolyLoop *this_local;
  
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
                    super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
                  super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x13];
  *(void **)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x14];
  *(void **)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30 = vtt[0x15];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL> *)
             &(this->super_IfcLoop).field_0x40);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPolyLoop,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPolyLoop,_1UL> *)
             &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30,vtt + 0x10);
  IfcLoop::~IfcLoop(&this->super_IfcLoop,vtt + 1);
  return;
}

Assistant:

IfcPolyLoop() : Object("IfcPolyLoop") {}